

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O2

c_int validate_settings(OSQPSettings *settings)

{
  double dVar1;
  double dVar2;
  char *__format;
  
  if (settings == (OSQPSettings *)0x0) {
    printf("ERROR in %s: ","validate_settings");
    __format = "Missing settings!";
  }
  else if (settings->scaling < 0) {
    printf("ERROR in %s: ","validate_settings");
    __format = "scaling must be nonnegative";
  }
  else if ((ulong)settings->adaptive_rho < 2) {
    if (settings->adaptive_rho_interval < 0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "adaptive_rho_interval must be nonnegative";
    }
    else if (settings->adaptive_rho_fraction <= 0.0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "adaptive_rho_fraction must be positive";
    }
    else if (settings->adaptive_rho_tolerance <= 1.0 && settings->adaptive_rho_tolerance != 1.0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "adaptive_rho_tolerance must be >= 1";
    }
    else if (settings->polish_refine_iter < 0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "polish_refine_iter must be nonnegative";
    }
    else if (settings->rho <= 0.0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "rho must be positive";
    }
    else if (settings->sigma <= 0.0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "sigma must be positive";
    }
    else if (settings->delta <= 0.0) {
      printf("ERROR in %s: ","validate_settings");
      __format = "delta must be positive";
    }
    else if (settings->max_iter < 1) {
      printf("ERROR in %s: ","validate_settings");
      __format = "max_iter must be positive";
    }
    else {
      dVar1 = settings->eps_abs;
      if (dVar1 < 0.0) {
        printf("ERROR in %s: ","validate_settings");
        __format = "eps_abs must be nonnegative";
      }
      else {
        dVar2 = settings->eps_rel;
        if (dVar2 < 0.0) {
          printf("ERROR in %s: ","validate_settings");
          __format = "eps_rel must be nonnegative";
        }
        else if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar2 != 0.0)) || (NAN(dVar2))) {
          if (settings->eps_prim_inf <= 0.0) {
            printf("ERROR in %s: ","validate_settings");
            __format = "eps_prim_inf must be positive";
          }
          else if (settings->eps_dual_inf <= 0.0) {
            printf("ERROR in %s: ","validate_settings");
            __format = "eps_dual_inf must be positive";
          }
          else if ((settings->alpha <= 0.0) || (2.0 <= settings->alpha)) {
            printf("ERROR in %s: ","validate_settings");
            __format = "alpha must be strictly between 0 and 2";
          }
          else if (settings->linsys_solver < 2) {
            if ((ulong)settings->verbose < 2) {
              if ((ulong)settings->scaled_termination < 2) {
                if (settings->check_termination < 0) {
                  printf("ERROR in %s: ","validate_settings");
                  __format = "check_termination must be nonnegative";
                }
                else {
                  if ((ulong)settings->warm_start < 2) {
                    if (0.0 < settings->time_limit || settings->time_limit == 0.0) {
                      return 0;
                    }
                    printf("ERROR in %s: ","validate_settings");
                    puts("time_limit must be nonnegative");
                    goto LAB_0018eabd;
                  }
                  printf("ERROR in %s: ","validate_settings");
                  __format = "warm_start must be either 0 or 1";
                }
              }
              else {
                printf("ERROR in %s: ","validate_settings");
                __format = "scaled_termination must be either 0 or 1";
              }
            }
            else {
              printf("ERROR in %s: ","validate_settings");
              __format = "verbose must be either 0 or 1";
            }
          }
          else {
            printf("ERROR in %s: ","validate_settings");
            __format = "linsys_solver not recognized";
          }
        }
        else {
          printf("ERROR in %s: ","validate_settings");
          __format = "at least one of eps_abs and eps_rel must be positive";
        }
      }
    }
  }
  else {
    printf("ERROR in %s: ","validate_settings");
    __format = "adaptive_rho must be either 0 or 1";
  }
  printf(__format);
LAB_0018eabd:
  putchar(10);
  return 1;
}

Assistant:

c_int validate_settings(const OSQPSettings *settings) {
  if (!settings) {
# ifdef PRINTING
    c_eprint("Missing settings!");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->scaling < 0) {
# ifdef PRINTING
    c_eprint("scaling must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->adaptive_rho != 0) && (settings->adaptive_rho != 1)) {
# ifdef PRINTING
    c_eprint("adaptive_rho must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->adaptive_rho_interval < 0) {
# ifdef PRINTING
    c_eprint("adaptive_rho_interval must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }
# ifdef PROFILING

  if (settings->adaptive_rho_fraction <= 0) {
#  ifdef PRINTING
    c_eprint("adaptive_rho_fraction must be positive");
#  endif /* ifdef PRINTING */
    return 1;
  }
# endif /* ifdef PROFILING */

  if (settings->adaptive_rho_tolerance < 1.0) {
# ifdef PRINTING
    c_eprint("adaptive_rho_tolerance must be >= 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->polish_refine_iter < 0) {
# ifdef PRINTING
    c_eprint("polish_refine_iter must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->rho <= 0.0) {
# ifdef PRINTING
    c_eprint("rho must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->sigma <= 0.0) {
# ifdef PRINTING
    c_eprint("sigma must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->delta <= 0.0) {
# ifdef PRINTING
    c_eprint("delta must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->max_iter <= 0) {
# ifdef PRINTING
    c_eprint("max_iter must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_abs < 0.0) {
# ifdef PRINTING
    c_eprint("eps_abs must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_rel < 0.0) {
# ifdef PRINTING
    c_eprint("eps_rel must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->eps_rel == 0.0) &&
      (settings->eps_abs == 0.0)) {
# ifdef PRINTING
    c_eprint("at least one of eps_abs and eps_rel must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_prim_inf <= 0.0) {
# ifdef PRINTING
    c_eprint("eps_prim_inf must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_dual_inf <= 0.0) {
# ifdef PRINTING
    c_eprint("eps_dual_inf must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->alpha <= 0.0) ||
      (settings->alpha >= 2.0)) {
# ifdef PRINTING
    c_eprint("alpha must be strictly between 0 and 2");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (validate_linsys_solver(settings->linsys_solver)) {
# ifdef PRINTING
    c_eprint("linsys_solver not recognized");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->verbose != 0) &&
      (settings->verbose != 1)) {
# ifdef PRINTING
    c_eprint("verbose must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->scaled_termination != 0) &&
      (settings->scaled_termination != 1)) {
# ifdef PRINTING
    c_eprint("scaled_termination must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->check_termination < 0) {
# ifdef PRINTING
    c_eprint("check_termination must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->warm_start != 0) &&
      (settings->warm_start != 1)) {
# ifdef PRINTING
    c_eprint("warm_start must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }
# ifdef PROFILING

  if (settings->time_limit < 0.0) {
#  ifdef PRINTING
    c_eprint("time_limit must be nonnegative\n");
#  endif /* ifdef PRINTING */
    return 1;
  }
# endif /* ifdef PROFILING */

  return 0;
}